

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::ObjectIntersector1<true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar14;
  byte bVar15;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar16) [32];
  long lVar17;
  byte bVar18;
  _func_int **pp_Var19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  float fVar38;
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined4 uVar41;
  undefined8 uVar42;
  float fVar43;
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  long lStack_24e0;
  StackItemT<embree::NodeRefPtr<8>_> *local_24d8;
  int mask;
  ulong local_24c8;
  RayHit *local_24c0;
  RayQueryContext *local_24b8;
  long local_24b0;
  long local_24a8;
  RTCIntersectFunctionNArguments local_24a0;
  Geometry *local_2470;
  undefined8 local_2468;
  RTCIntersectArguments *local_2460;
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_24d8 = stack + 1;
    stack[0].dist = 0;
    aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar7 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    fVar38 = (ray->super_RayK<1>).tfar;
    auVar40 = ZEXT464((uint)fVar38);
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar27 = vandps_avx512vl((undefined1  [16])aVar1,auVar8);
    auVar29._8_4_ = 0x219392ef;
    auVar29._0_8_ = 0x219392ef219392ef;
    auVar29._12_4_ = 0x219392ef;
    auVar8 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar38));
    uVar21 = vcmpps_avx512vl(auVar27,auVar29,1);
    bVar25 = (bool)((byte)uVar21 & 1);
    auVar28._0_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * (int)aVar1.x;
    bVar25 = (bool)((byte)(uVar21 >> 1) & 1);
    auVar28._4_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * (int)aVar1.y;
    bVar25 = (bool)((byte)(uVar21 >> 2) & 1);
    auVar28._8_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * (int)aVar1.z;
    bVar25 = (bool)((byte)(uVar21 >> 3) & 1);
    auVar28._12_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * aVar1.field_3.a;
    auVar29 = vrcp14ps_avx512vl(auVar28);
    auVar27._8_4_ = 0x3f800000;
    auVar27._0_8_ = 0x3f8000003f800000;
    auVar27._12_4_ = 0x3f800000;
    auVar27 = vfnmadd213ps_avx512vl(auVar28,auVar29,auVar27);
    auVar29 = vfmadd132ps_fma(auVar27,auVar29,auVar29);
    fVar38 = auVar29._0_4_;
    local_2398._4_4_ = fVar38;
    local_2398._0_4_ = fVar38;
    local_2398._8_4_ = fVar38;
    local_2398._12_4_ = fVar38;
    local_2398._16_4_ = fVar38;
    local_2398._20_4_ = fVar38;
    local_2398._24_4_ = fVar38;
    local_2398._28_4_ = fVar38;
    auVar45 = ZEXT3264(local_2398);
    auVar27 = vmovshdup_avx(auVar29);
    uVar42 = auVar27._0_8_;
    local_23b8._8_8_ = uVar42;
    local_23b8._0_8_ = uVar42;
    local_23b8._16_8_ = uVar42;
    local_23b8._24_8_ = uVar42;
    auVar46 = ZEXT3264(local_23b8);
    auVar28 = vshufpd_avx(auVar29,auVar29,1);
    auVar31._8_4_ = 2;
    auVar31._0_8_ = 0x200000002;
    auVar31._12_4_ = 2;
    auVar31._16_4_ = 2;
    auVar31._20_4_ = 2;
    auVar31._24_4_ = 2;
    auVar31._28_4_ = 2;
    fVar43 = fVar38 * (ray->super_RayK<1>).org.field_0.m128[0];
    local_23d8 = vpermps_avx2(auVar31,ZEXT1632(auVar29));
    auVar47 = ZEXT3264(local_23d8);
    auVar30._8_4_ = 1;
    auVar30._0_8_ = 0x100000001;
    auVar30._12_4_ = 1;
    auVar30._16_4_ = 1;
    auVar30._20_4_ = 1;
    auVar30._24_4_ = 1;
    auVar30._28_4_ = 1;
    auVar32 = ZEXT1632(CONCAT412(auVar29._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar29._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar29._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar43))
                                ));
    auVar30 = vpermps_avx2(auVar30,auVar32);
    auVar31 = vpermps_avx2(auVar31,auVar32);
    uVar21 = (ulong)(fVar38 < 0.0) << 5;
    uVar24 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x40;
    uVar20 = (ulong)(auVar28._0_4_ < 0.0) << 5 | 0x80;
    uVar23 = uVar21 ^ 0x20;
    uVar41 = auVar7._0_4_;
    local_23f8._4_4_ = uVar41;
    local_23f8._0_4_ = uVar41;
    local_23f8._8_4_ = uVar41;
    local_23f8._12_4_ = uVar41;
    local_23f8._16_4_ = uVar41;
    local_23f8._20_4_ = uVar41;
    local_23f8._24_4_ = uVar41;
    local_23f8._28_4_ = uVar41;
    auVar48 = ZEXT3264(local_23f8);
    uVar41 = auVar8._0_4_;
    auVar39 = ZEXT3264(CONCAT428(uVar41,CONCAT424(uVar41,CONCAT420(uVar41,CONCAT416(uVar41,CONCAT412
                                                  (uVar41,CONCAT48(uVar41,CONCAT44(uVar41,uVar41))))
                                                  ))));
    auVar32._8_4_ = 0x80000000;
    auVar32._0_8_ = 0x8000000080000000;
    auVar32._12_4_ = 0x80000000;
    auVar32._16_4_ = 0x80000000;
    auVar32._20_4_ = 0x80000000;
    auVar32._24_4_ = 0x80000000;
    auVar32._28_4_ = 0x80000000;
    local_2418._0_8_ = CONCAT44(fVar43,fVar43) ^ 0x8000000080000000;
    local_2418._8_4_ = -fVar43;
    local_2418._12_4_ = -fVar43;
    local_2418._16_4_ = -fVar43;
    local_2418._20_4_ = -fVar43;
    local_2418._24_4_ = -fVar43;
    local_2418._28_4_ = -fVar43;
    auVar49 = ZEXT3264(local_2418);
    local_2438._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
    local_2438._8_4_ = auVar30._8_4_ ^ 0x80000000;
    local_2438._12_4_ = auVar30._12_4_ ^ 0x80000000;
    local_2438._16_4_ = auVar30._16_4_ ^ 0x80000000;
    local_2438._20_4_ = auVar30._20_4_ ^ 0x80000000;
    local_2438._24_4_ = auVar30._24_4_ ^ 0x80000000;
    local_2438._28_4_ = auVar30._28_4_ ^ 0x80000000;
    auVar44 = ZEXT3264(local_2438);
    local_2458 = vxorps_avx512vl(auVar31,auVar32);
    auVar50 = ZEXT3264(local_2458);
    auVar30 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar51 = ZEXT3264(auVar30);
    auVar30 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar52 = ZEXT3264(auVar30);
    local_24c8 = uVar21;
    local_24c0 = ray;
    local_24b8 = context;
LAB_01c7b44b:
    if (local_24d8 != stack) {
      pSVar14 = local_24d8 + -1;
      local_24d8 = local_24d8 + -1;
      if ((float)pSVar14->dist <= auVar40._0_4_) {
        sVar22 = (local_24d8->ptr).ptr;
LAB_01c7b472:
        uVar41 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
        auVar35._4_4_ = uVar41;
        auVar35._0_4_ = uVar41;
        auVar35._8_4_ = uVar41;
        auVar35._12_4_ = uVar41;
        auVar35._16_4_ = uVar41;
        auVar35._20_4_ = uVar41;
        auVar35._24_4_ = uVar41;
        auVar35._28_4_ = uVar41;
        while ((sVar22 & 8) == 0) {
          pauVar16 = (undefined1 (*) [32])(sVar22 & 0xfffffffffffffff0);
          auVar7 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar16[8] + uVar21),auVar35,
                                   *(undefined1 (*) [32])(pauVar16[2] + uVar21));
          auVar7 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar45._0_32_,auVar49._0_32_);
          auVar30 = vmaxps_avx(auVar48._0_32_,ZEXT1632(auVar7));
          auVar7 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar16[8] + uVar24),auVar35,
                                   *(undefined1 (*) [32])(pauVar16[2] + uVar24));
          auVar8 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar16[8] + uVar20),auVar35,
                                   *(undefined1 (*) [32])(pauVar16[2] + uVar20));
          auVar7 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar46._0_32_,auVar44._0_32_);
          auVar31 = vfmadd213ps_avx512vl(ZEXT1632(auVar8),auVar47._0_32_,auVar50._0_32_);
          auVar31 = vmaxps_avx(ZEXT1632(auVar7),auVar31);
          auVar30 = vmaxps_avx(auVar30,auVar31);
          auVar7 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar16[8] + uVar23),auVar35,
                                   *(undefined1 (*) [32])(pauVar16[2] + uVar23));
          auVar7 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar45._0_32_,auVar49._0_32_);
          auVar31 = vminps_avx(auVar39._0_32_,ZEXT1632(auVar7));
          auVar7 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar16[8] + (uVar24 ^ 0x20)),auVar35,
                                   *(undefined1 (*) [32])(pauVar16[2] + (uVar24 ^ 0x20)));
          auVar8 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar16[8] + (uVar20 ^ 0x20)),auVar35,
                                   *(undefined1 (*) [32])(pauVar16[2] + (uVar20 ^ 0x20)));
          auVar7 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar46._0_32_,auVar44._0_32_);
          auVar32 = vfmadd213ps_avx512vl(ZEXT1632(auVar8),auVar47._0_32_,auVar50._0_32_);
          auVar32 = vminps_avx(ZEXT1632(auVar7),auVar32);
          auVar31 = vminps_avx(auVar31,auVar32);
          uVar26 = vcmpps_avx512vl(auVar30,auVar31,2);
          if (((uint)sVar22 & 7) == 6) {
            uVar11 = vcmpps_avx512vl(auVar35,pauVar16[0xe],0xd);
            uVar12 = vcmpps_avx512vl(auVar35,pauVar16[0xf],1);
            uVar26 = uVar26 & uVar11 & uVar12;
          }
          bVar15 = (byte)uVar26;
          if (bVar15 == 0) {
            auVar7 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                            ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar40 = ZEXT1664(auVar7);
            goto LAB_01c7b44b;
          }
          auVar31 = *pauVar16;
          auVar32 = pauVar16[1];
          auVar33 = vmovdqa64_avx512vl(auVar51._0_32_);
          auVar33 = vpternlogd_avx512vl(auVar33,auVar30,auVar52._0_32_,0xf8);
          auVar34 = vpcompressd_avx512vl(auVar33);
          auVar36._0_4_ =
               (uint)(bVar15 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar33._0_4_;
          bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
          auVar36._4_4_ = (uint)bVar25 * auVar34._4_4_ | (uint)!bVar25 * auVar33._4_4_;
          bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
          auVar36._8_4_ = (uint)bVar25 * auVar34._8_4_ | (uint)!bVar25 * auVar33._8_4_;
          bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
          auVar36._12_4_ = (uint)bVar25 * auVar34._12_4_ | (uint)!bVar25 * auVar33._12_4_;
          bVar25 = (bool)((byte)(uVar26 >> 4) & 1);
          auVar36._16_4_ = (uint)bVar25 * auVar34._16_4_ | (uint)!bVar25 * auVar33._16_4_;
          bVar25 = (bool)((byte)(uVar26 >> 5) & 1);
          auVar36._20_4_ = (uint)bVar25 * auVar34._20_4_ | (uint)!bVar25 * auVar33._20_4_;
          bVar25 = (bool)((byte)(uVar26 >> 6) & 1);
          auVar36._24_4_ = (uint)bVar25 * auVar34._24_4_ | (uint)!bVar25 * auVar33._24_4_;
          bVar25 = SUB81(uVar26 >> 7,0);
          auVar36._28_4_ = (uint)bVar25 * auVar34._28_4_ | (uint)!bVar25 * auVar33._28_4_;
          auVar33 = vpermt2q_avx512vl(auVar31,auVar36,auVar32);
          sVar22 = auVar33._0_8_;
          bVar15 = bVar15 - 1 & bVar15;
          if (bVar15 != 0) goto LAB_01c7b5b0;
        }
        local_24b0 = (ulong)((uint)sVar22 & 0xf) - 8;
        for (local_24a8 = 0; local_24b0 != local_24a8; local_24a8 = local_24a8 + 1) {
          local_24a0.geomID = *(uint *)((sVar22 & 0xfffffffffffffff0) + local_24a8 * 8);
          local_2470 = (context->scene->geometries).items[local_24a0.geomID].ptr;
          if (((ray->super_RayK<1>).mask & local_2470->mask) != 0) {
            local_24a0.primID = *(uint *)((sVar22 & 0xfffffffffffffff0) + 4 + local_24a8 * 8);
            mask = -1;
            local_24a0.valid = &mask;
            local_24a0.geometryUserPtr = local_2470->userPtr;
            local_24a0.context = context->user;
            local_24a0.N = 1;
            local_2468 = 0;
            local_2460 = context->args;
            pp_Var19 = (_func_int **)local_2460->intersect;
            if (pp_Var19 == (_func_int **)0x0) {
              pp_Var19 = local_2470[1].super_RefCount._vptr_RefCount;
            }
            local_24a0.rayhit = (RTCRayHitN *)ray;
            (*(code *)pp_Var19)(&local_24a0);
            auVar45 = ZEXT3264(local_2398);
            auVar46 = ZEXT3264(local_23b8);
            auVar47 = ZEXT3264(local_23d8);
            auVar48 = ZEXT3264(local_23f8);
            auVar49 = ZEXT3264(local_2418);
            auVar44 = ZEXT3264(local_2438);
            auVar50 = ZEXT3264(local_2458);
            auVar30 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
            auVar51 = ZEXT3264(auVar30);
            auVar30 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
            auVar52 = ZEXT3264(auVar30);
            context = local_24b8;
            ray = local_24c0;
            uVar21 = local_24c8;
          }
        }
        fVar38 = (ray->super_RayK<1>).tfar;
        auVar39 = ZEXT3264(CONCAT428(fVar38,CONCAT424(fVar38,CONCAT420(fVar38,CONCAT416(fVar38,
                                                  CONCAT412(fVar38,CONCAT48(fVar38,CONCAT44(fVar38,
                                                  fVar38))))))));
        auVar40 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      }
      goto LAB_01c7b44b;
    }
  }
  return;
LAB_01c7b5b0:
  auVar35 = vpshufd_avx2(auVar36,0x55);
  vpermt2q_avx512vl(auVar31,auVar35,auVar32);
  auVar33 = vpminsd_avx2(auVar36,auVar35);
  auVar35 = vpmaxsd_avx2(auVar36,auVar35);
  bVar15 = bVar15 - 1 & bVar15;
  if (bVar15 == 0) {
    auVar33 = vpermi2q_avx512vl(auVar33,auVar31,auVar32);
    sVar22 = auVar33._0_8_;
    auVar31 = vpermt2q_avx512vl(auVar31,auVar35,auVar32);
    (local_24d8->ptr).ptr = auVar31._0_8_;
    lVar17 = 8;
    lStack_24e0 = 0x10;
  }
  else {
    auVar10 = vpshufd_avx2(auVar36,0xaa);
    vpermt2q_avx512vl(auVar31,auVar10,auVar32);
    auVar34 = vpminsd_avx2(auVar33,auVar10);
    auVar33 = vpmaxsd_avx2(auVar33,auVar10);
    auVar10 = vpminsd_avx2(auVar35,auVar33);
    auVar33 = vpmaxsd_avx2(auVar35,auVar33);
    bVar15 = bVar15 - 1 & bVar15;
    if (bVar15 == 0) {
      auVar35 = vpermi2q_avx512vl(auVar34,auVar31,auVar32);
      sVar22 = auVar35._0_8_;
      auVar35 = vpermt2q_avx512vl(auVar31,auVar33,auVar32);
      (local_24d8->ptr).ptr = auVar35._0_8_;
      auVar35 = vpermd_avx2(auVar33,auVar30);
      local_24d8->dist = auVar35._0_4_;
      auVar31 = vpermt2q_avx512vl(auVar31,auVar10,auVar32);
      local_24d8[1].ptr.ptr = auVar31._0_8_;
      lStack_24e0 = 0x18;
      lVar17 = lStack_24e0;
      lStack_24e0 = 0x20;
      auVar35 = auVar10;
    }
    else {
      auVar35 = vpshufd_avx2(auVar36,0xff);
      vpermt2q_avx512vl(auVar31,auVar35,auVar32);
      auVar9 = vpminsd_avx2(auVar34,auVar35);
      auVar34 = vpmaxsd_avx2(auVar34,auVar35);
      auVar35 = vpminsd_avx2(auVar10,auVar34);
      auVar34 = vpmaxsd_avx2(auVar10,auVar34);
      auVar10 = vpminsd_avx2(auVar33,auVar34);
      auVar33 = vpmaxsd_avx2(auVar33,auVar34);
      bVar15 = bVar15 - 1 & bVar15;
      if (bVar15 != 0) {
        auVar37 = valignd_avx512vl(auVar36,auVar36,3);
        auVar36 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
        auVar34 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                       CONCAT48(0x80000000,0x8000000080000000))),
                                    auVar36,auVar9);
        auVar36 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
        auVar35 = vpermt2d_avx512vl(auVar34,auVar36,auVar35);
        auVar36 = vpermt2d_avx512vl(auVar35,auVar36,auVar10);
        auVar35 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
        auVar35 = vpermt2d_avx512vl(auVar36,auVar35,auVar33);
        auVar40 = ZEXT3264(auVar35);
        bVar18 = bVar15;
        do {
          auVar33 = auVar40._0_32_;
          auVar34._8_4_ = 1;
          auVar34._0_8_ = 0x100000001;
          auVar34._12_4_ = 1;
          auVar34._16_4_ = 1;
          auVar34._20_4_ = 1;
          auVar34._24_4_ = 1;
          auVar34._28_4_ = 1;
          auVar35 = vpermd_avx2(auVar34,auVar37);
          auVar37 = valignd_avx512vl(auVar37,auVar37,1);
          vpermt2q_avx512vl(auVar31,auVar37,auVar32);
          bVar18 = bVar18 - 1 & bVar18;
          uVar42 = vpcmpd_avx512vl(auVar35,auVar33,5);
          auVar35 = vpmaxsd_avx2(auVar35,auVar33);
          bVar13 = (byte)uVar42 << 1;
          auVar33 = valignd_avx512vl(auVar33,auVar33,7);
          bVar25 = (bool)((byte)uVar42 & 1);
          bVar2 = (bool)(bVar13 >> 2 & 1);
          bVar3 = (bool)(bVar13 >> 3 & 1);
          bVar4 = (bool)(bVar13 >> 4 & 1);
          bVar5 = (bool)(bVar13 >> 5 & 1);
          bVar6 = (bool)(bVar13 >> 6 & 1);
          auVar40 = ZEXT3264(CONCAT428((uint)(bVar13 >> 7) * auVar33._28_4_ |
                                       (uint)!(bool)(bVar13 >> 7) * auVar35._28_4_,
                                       CONCAT424((uint)bVar6 * auVar33._24_4_ |
                                                 (uint)!bVar6 * auVar35._24_4_,
                                                 CONCAT420((uint)bVar5 * auVar33._20_4_ |
                                                           (uint)!bVar5 * auVar35._20_4_,
                                                           CONCAT416((uint)bVar4 * auVar33._16_4_ |
                                                                     (uint)!bVar4 * auVar35._16_4_,
                                                                     CONCAT412((uint)bVar3 *
                                                                               auVar33._12_4_ |
                                                                               (uint)!bVar3 *
                                                                               auVar35._12_4_,
                                                                               CONCAT48((uint)bVar2
                                                                                        * auVar33.
                                                  _8_4_ | (uint)!bVar2 * auVar35._8_4_,
                                                  CONCAT44((uint)bVar25 * auVar33._4_4_ |
                                                           (uint)!bVar25 * auVar35._4_4_,
                                                           auVar35._0_4_))))))));
        } while (bVar18 != 0);
        lVar17 = (ulong)(uint)POPCOUNT((uint)bVar15) + 3;
        while( true ) {
          auVar33 = auVar40._0_32_;
          auVar35 = vpermt2q_avx512vl(auVar31,auVar33,auVar32);
          sVar22 = auVar35._0_8_;
          bVar25 = lVar17 == 0;
          lVar17 = lVar17 + -1;
          if (bVar25) break;
          (local_24d8->ptr).ptr = sVar22;
          auVar35 = vpermd_avx2(auVar33,auVar30);
          local_24d8->dist = auVar35._0_4_;
          auVar35 = valignd_avx512vl(auVar33,auVar33,1);
          auVar40 = ZEXT3264(auVar35);
          local_24d8 = local_24d8 + 1;
        }
        goto LAB_01c7b472;
      }
      auVar36 = vpermi2q_avx512vl(auVar9,auVar31,auVar32);
      sVar22 = auVar36._0_8_;
      auVar36 = vpermt2q_avx512vl(auVar31,auVar33,auVar32);
      (local_24d8->ptr).ptr = auVar36._0_8_;
      auVar33 = vpermd_avx2(auVar33,auVar30);
      local_24d8->dist = auVar33._0_4_;
      auVar33 = vpermt2q_avx512vl(auVar31,auVar10,auVar32);
      local_24d8[1].ptr.ptr = auVar33._0_8_;
      auVar33 = vpermd_avx2(auVar10,auVar30);
      local_24d8[1].dist = auVar33._0_4_;
      auVar31 = vpermt2q_avx512vl(auVar31,auVar35,auVar32);
      local_24d8[2].ptr.ptr = auVar31._0_8_;
      lVar17 = 0x28;
      lStack_24e0 = 0x30;
    }
  }
  auVar30 = vpermd_avx2(auVar35,auVar30);
  *(int *)((long)&(local_24d8->ptr).ptr + lVar17) = auVar30._0_4_;
  local_24d8 = (StackItemT<embree::NodeRefPtr<8>_> *)((long)&(local_24d8->ptr).ptr + lStack_24e0);
  goto LAB_01c7b472;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }